

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_file_name.hpp
# Opt level: O2

size_t pstore::
       process_file_name<unsigned_long(*)(pstore::gsl::span<char,_1l>),std::vector<char,std::allocator<char>>>
                 (_func_unsigned_long_span<char,__1L> *get_process_path,
                 vector<char,_std::allocator<char>_> *buffer)

{
  ulong uVar1;
  unsigned_long uVar2;
  ulong __new_size;
  span<char,__1L> sVar3;
  
  uVar1 = (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage -
          (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  __new_size = 2;
  if (2 < uVar1) {
    __new_size = uVar1;
  }
  do {
    while( true ) {
      std::vector<char,_std::allocator<char>_>::resize(buffer,__new_size);
      sVar3 = gsl::make_span<std::vector<char,std::allocator<char>>>(buffer);
      uVar2 = (*get_process_path)(sVar3);
      uVar1 = (__new_size >> 1) + __new_size;
      __new_size = uVar1;
      if (uVar1 < uVar2) {
        __new_size = uVar2;
      }
      if (uVar2 != 0) break;
      if (0xffffff < uVar1) goto LAB_0014fe9d;
    }
  } while ((__new_size < 0x1000000) &&
          ((ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start) <= uVar2));
  if (__new_size < 0x1000000) {
    return uVar2;
  }
LAB_0014fe9d:
  raise<pstore::error_code>(unknown_process_path);
}

Assistant:

std::size_t process_file_name (ProcessPathFunction get_process_path, BufferType & buffer) {
        static_assert (std::is_same<typename BufferType::value_type, char>::value,
                       "BufferType::value_type must be char");
        constexpr auto const max_reasonable_size = std::size_t{16 * 1024 * 1024};
        auto size = std::size_t{0};
        auto next_size = std::max (buffer.capacity (), std::size_t{2});
        do {
            buffer.resize (next_size);
            size = get_process_path (::pstore::gsl::make_span (buffer));
            next_size = std::max (size, next_size + next_size / 2U);
        } while ((size == 0 || size >= buffer.size ()) && next_size < max_reasonable_size);
        if (next_size >= max_reasonable_size) {
            raise (error_code::unknown_process_path);
        }
        return size;
    }